

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O0

Boxed_Value
chaiscript::detail::Dynamic_Caster<std::runtime_error,_chaiscript::exception::eval_error>::cast
          (Boxed_Value *t_from)

{
  bool bVar1;
  Result_Type prVar2;
  Result_Type prVar3;
  long lVar4;
  undefined8 uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  element_type *in_RDI;
  Boxed_Value BVar7;
  eval_error *data_1;
  runtime_error *d_1;
  eval_error *data;
  runtime_error *d;
  eval_error *in_stack_fffffffffffffee8;
  Boxed_Value *in_stack_fffffffffffffef0;
  undefined1 uVar8;
  Type_Info *in_stack_fffffffffffffef8;
  Type_Info *in_stack_ffffffffffffff00;
  allocator *paVar9;
  element_type *this;
  allocator local_b9;
  string *in_stack_ffffffffffffff48;
  type_info *in_stack_ffffffffffffff50;
  Type_Info *in_stack_ffffffffffffff58;
  bad_boxed_dynamic_cast *in_stack_ffffffffffffff60;
  
  this = in_RDI;
  Boxed_Value::get_type_info((Boxed_Value *)0x3be7c1);
  user_type<std::runtime_error>();
  bVar1 = Type_Info::bare_equal(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  if (!bVar1) {
    uVar5 = __cxa_allocate_exception(0x48);
    Boxed_Value::get_type_info((Boxed_Value *)0x3bea3e);
    paVar9 = &local_b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff48,"Unknown dynamic_cast_conversion",paVar9);
    chaiscript::exception::bad_boxed_dynamic_cast::bad_boxed_dynamic_cast
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff48);
    __cxa_throw(uVar5,&chaiscript::exception::bad_boxed_dynamic_cast::typeinfo,
                chaiscript::exception::bad_boxed_dynamic_cast::~bad_boxed_dynamic_cast);
  }
  bVar1 = Boxed_Value::is_pointer((Boxed_Value *)0x3be7fb);
  if (bVar1) {
    bVar1 = Boxed_Value::is_const((Boxed_Value *)0x3be811);
    if (bVar1) {
      cast::anon_class_8_1_6c80e9d3::operator()((anon_class_8_1_6c80e9d3 *)this);
      Boxed_Value::Boxed_Value<std::shared_ptr<chaiscript::exception::eval_error_const>,void>
                (in_stack_fffffffffffffef0,
                 (shared_ptr<const_chaiscript::exception::eval_error> *)in_stack_fffffffffffffee8,
                 false);
      std::shared_ptr<const_chaiscript::exception::eval_error>::~shared_ptr
                ((shared_ptr<const_chaiscript::exception::eval_error> *)0x3be861);
      _Var6._M_pi = extraout_RDX;
    }
    else {
      cast::anon_class_8_1_6c80e9d3::operator()((anon_class_8_1_6c80e9d3 *)this);
      Boxed_Value::Boxed_Value<std::shared_ptr<chaiscript::exception::eval_error>,void>
                (in_stack_fffffffffffffef0,
                 (shared_ptr<chaiscript::exception::eval_error> *)in_stack_fffffffffffffee8,false);
      std::shared_ptr<chaiscript::exception::eval_error>::~shared_ptr
                ((shared_ptr<chaiscript::exception::eval_error> *)0x3be8d6);
      _Var6._M_pi = extraout_RDX_00;
    }
  }
  else {
    bVar1 = Boxed_Value::is_const((Boxed_Value *)0x3be90e);
    if (bVar1) {
      prVar2 = Cast_Helper<const_std::runtime_error_&>::cast
                         (in_stack_fffffffffffffef0,
                          (Type_Conversions_State *)in_stack_fffffffffffffee8);
      uVar8 = (undefined1)((ulong)in_stack_fffffffffffffef0 >> 0x38);
      lVar4 = __dynamic_cast(prVar2,&std::runtime_error::typeinfo,
                             &chaiscript::exception::eval_error::typeinfo,0);
      if (lVar4 == 0) {
        __cxa_bad_cast();
      }
      std::cref<chaiscript::exception::eval_error>(in_stack_fffffffffffffee8);
      Boxed_Value::Boxed_Value<std::reference_wrapper<chaiscript::exception::eval_error_const>,void>
                ((Boxed_Value *)in_stack_ffffffffffffff00,
                 (reference_wrapper<const_chaiscript::exception::eval_error> *)
                 in_stack_fffffffffffffef8,(bool)uVar8);
      _Var6._M_pi = extraout_RDX_01;
    }
    else {
      prVar3 = Cast_Helper<std::runtime_error_&>::cast
                         (in_stack_fffffffffffffef0,
                          (Type_Conversions_State *)in_stack_fffffffffffffee8);
      uVar8 = (undefined1)((ulong)in_stack_fffffffffffffef0 >> 0x38);
      lVar4 = __dynamic_cast(prVar3,&std::runtime_error::typeinfo,
                             &chaiscript::exception::eval_error::typeinfo,0);
      if (lVar4 == 0) {
        __cxa_bad_cast();
      }
      std::ref<chaiscript::exception::eval_error>(in_stack_fffffffffffffee8);
      Boxed_Value::Boxed_Value<std::reference_wrapper<chaiscript::exception::eval_error>,void>
                ((Boxed_Value *)in_stack_ffffffffffffff00,
                 (reference_wrapper<chaiscript::exception::eval_error> *)in_stack_fffffffffffffef8,
                 (bool)uVar8);
      _Var6._M_pi = extraout_RDX_02;
    }
  }
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var6._M_pi;
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value cast(const Boxed_Value &t_from)
          {
            if (t_from.get_type_info().bare_equal(chaiscript::user_type<From>()))
            {
              if (t_from.is_pointer())
              {
                // Dynamic cast out the contained boxed value, which we know is the type we want
                if (t_from.is_const())
                {
                  return Boxed_Value(
                      [&]()->std::shared_ptr<const To>{
                        if (auto data = std::dynamic_pointer_cast<const To>(detail::Cast_Helper<std::shared_ptr<const From> >::cast(t_from, nullptr)))
                        {
                          return data;
                        } else {
                          throw std::bad_cast();
                        }
                      }()
                      );
                } else {
                  return Boxed_Value(
                      [&]()->std::shared_ptr<To>{
                        if (auto data = std::dynamic_pointer_cast<To>(detail::Cast_Helper<std::shared_ptr<From> >::cast(t_from, nullptr)))
                        {
                          return data;
                        } else {
#ifdef CHAISCRIPT_LIBCPP
                          /// \todo fix this someday after libc++ is fixed.
                          if (std::string(typeid(To).name()).find("Assignable_Proxy_Function") != std::string::npos) {
                            auto from = detail::Cast_Helper<std::shared_ptr<From> >::cast(t_from, nullptr);
                            if (std::string(typeid(*from).name()).find("Assignable_Proxy_Function_Impl") != std::string::npos) {
                              return std::static_pointer_cast<To>(from);
                            }
                          }
#endif
                          throw std::bad_cast();
                        }
                      }()
                      );
                }
              } else {
                // Pull the reference out of the contained boxed value, which we know is the type we want
                if (t_from.is_const())
                {
                  const From &d = detail::Cast_Helper<const From &>::cast(t_from, nullptr);
                  const To &data = dynamic_cast<const To &>(d);
                  return Boxed_Value(std::cref(data));
                } else {
                  From &d = detail::Cast_Helper<From &>::cast(t_from, nullptr);
                  To &data = dynamic_cast<To &>(d);
                  return Boxed_Value(std::ref(data));
                }
              }
            } else {
              throw chaiscript::exception::bad_boxed_dynamic_cast(t_from.get_type_info(), typeid(To), "Unknown dynamic_cast_conversion");
            }
          }